

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O3

SerializeData * __thiscall
wallet::walletload_tests::MakeSerializeData<std::__cxx11::string,CPubKey>
          (SerializeData *__return_storage_ptr__,walletload_tests *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,CPubKey *args_1)

{
  long in_FS_OFFSET;
  DataStream local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.m_read_pos = 0;
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Serialize<DataStream,char>
            (&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  CPubKey::Serialize<DataStream>((CPubKey *)args,&local_38);
  (__return_storage_ptr__->super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)__return_storage_ptr__,
             local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start + local_38.m_read_pos,
             local_38.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

SerializeData MakeSerializeData(const Args&... args)
{
    DataStream s{};
    SerializeMany(s, args...);
    return {s.begin(), s.end()};
}